

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O0

void __thiscall
UnifiedRegex::RegexStacks::RegexStacks(RegexStacks *this,PageAllocator *pageAllocator)

{
  PageAllocator *pageAllocator_local;
  RegexStacks *this_local;
  
  ContStack::ContStack(&this->contStack,pageAllocator,Js::Throw::OutOfMemory);
  AssertionStack::AssertionStack(&this->assertionStack,pageAllocator,Js::Throw::OutOfMemory);
  return;
}

Assistant:

RegexStacks(PageAllocator * pageAllocator) :
            contStack(pageAllocator, Js::Throw::OutOfMemory),
            assertionStack(pageAllocator, Js::Throw::OutOfMemory) {}